

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O0

ivec4 ImageCodec::decodeSINT_SINTVec<signed_char,1>(ImageCodec *param_1,void *ptr)

{
  char cVar1;
  int *piVar2;
  vec<4,_int,_(glm::precision)0> *in_RSI;
  int i;
  char *data;
  ivec4 result;
  int local_2c;
  vec<4,_int,_(glm::precision)0> *this;
  anon_union_16_4_ea85571f_for_vec<4,_int,_(glm::precision)0>_3 local_10;
  
  this = in_RSI;
  glm::vec<4,_int,_(glm::precision)0>::vec
            ((vec<4,_int,_(glm::precision)0> *)&local_10.field_0,0,0,0,0);
  for (local_2c = 0; local_2c < 1; local_2c = local_2c + 1) {
    cVar1 = *(char *)((long)&in_RSI->field_0 + (long)local_2c);
    piVar2 = glm::vec<4,_int,_(glm::precision)0>::operator[]
                       (this,(length_type)((ulong)in_RSI >> 0x20));
    *piVar2 = (int)cVar1;
  }
  return (anon_union_16_4_ea85571f_for_vec<4,_int,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_int,_(glm::precision)0>_3)local_10.field_0;
}

Assistant:

static glm::ivec4 decodeSINT_SINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_signed_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::ivec4 result(0, 0, 0, 0);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i];
        return result;
    }